

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O2

void mafilter(double *sig,int N,int window,double *oup)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  void *__ptr;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  uVar3 = window / 2;
  iVar2 = uVar3 * 2;
  iVar8 = iVar2;
  if (iVar2 != window) {
    uVar3 = (window + -1) / 2;
    iVar8 = uVar3 * 2;
  }
  __ptr = malloc((long)(iVar8 + N) * 8);
  uVar4 = 0;
  uVar6 = 0;
  if (0 < (int)uVar3) {
    uVar6 = (ulong)uVar3;
  }
  for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    *(double *)((long)__ptr + uVar4 * 8) = *sig;
  }
  lVar7 = (long)(int)(uVar3 + N);
  lVar5 = (long)(int)uVar3;
  pdVar9 = sig;
  for (lVar10 = lVar5; lVar10 < lVar7; lVar10 = lVar10 + 1) {
    *(double *)((long)__ptr + lVar10 * 8) = *pdVar9;
    pdVar9 = pdVar9 + 1;
  }
  for (lVar10 = lVar7; lVar10 < iVar8 + N; lVar10 = lVar10 + 1) {
    *(double *)((long)__ptr + lVar10 * 8) = sig[(long)N + -1];
  }
  if (iVar2 == window) {
    lVar10 = lVar5 * 2;
    lVar11 = 0;
    for (lVar12 = lVar5; lVar12 < lVar7; lVar12 = lVar12 + 1) {
      dVar14 = 0.0;
      for (lVar13 = (long)(int)lVar11; lVar13 <= lVar12 + lVar5; lVar13 = lVar13 + 1) {
        dVar1 = *(double *)((long)__ptr + lVar13 * 8);
        dVar16 = dVar1 * 0.5 + dVar14;
        dVar15 = dVar16;
        if (lVar10 != lVar13) {
          dVar15 = dVar14 + dVar1;
        }
        dVar14 = dVar16;
        if (lVar11 != lVar13) {
          dVar14 = dVar15;
        }
      }
      oup[lVar12 - lVar5] = dVar14 / (double)window;
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 1;
    }
  }
  else {
    iVar8 = 0;
    for (lVar10 = lVar5; lVar10 < lVar7; lVar10 = lVar10 + 1) {
      dVar14 = 0.0;
      for (lVar12 = (long)iVar8; lVar12 <= lVar10 + lVar5; lVar12 = lVar12 + 1) {
        dVar14 = dVar14 + *(double *)((long)__ptr + lVar12 * 8);
      }
      oup[lVar10 - lVar5] = dVar14 / (double)window;
      iVar8 = iVar8 + 1;
    }
  }
  free(__ptr);
  return;
}

Assistant:

void mafilter(double *sig,int N, int window,double *oup) {
	int odd,q,N2,i,j;
	double sum;
	double *temp;
	/*
	 * mafilter is a moving average filter that smoothes the signal using
	 * a smoothing window. In this implementation, the signal is extended
	 * by the length of the window. Length floor(window/2) extension is carried
	 * out at the beginning of the signal by setting values of the signal
	 * to sig[0]. The rest of the extension is done at the tail of the signal
	 * by setting it equal to sig[N-1].
	 *
	 */
	
	odd = window - ((window/2) * 2);
	
	if (odd) {
		q = (window - 1 ) / 2; 
	} else {
		q = window / 2;
	}
	
	N2 = N + (2 * q);
	
	temp = (double*) malloc (sizeof(double) * N2);
	
	for (i = 0; i < q; ++i) {
		temp[i] = sig[0];
	}
	
	for (i = q; i < N + q; ++i) {
		temp[i] = sig[i - q];
	}
	
	for (i = N + q; i < N2; ++i) {
		temp[i] = sig[N-1];
	}
	
	if (odd) {
		for (i = q; i < N+q; ++i) {
			sum = 0.0;
			for (j = i - q; j < i + q + 1;j++) {
				sum += temp[j];
			}
			oup[i-q] = sum /window;
		}  
	} else {
		for (i = q; i < N+q; ++i) {
			sum = 0.0;
			for (j = i - q; j < i + q + 1;j++) {
				if ( j == i - q || j == i + q) {
					sum += 0.5 * temp[j];
				} else {
					sum += temp[j];
				}
			}
			oup[i-q] = sum /window;
		}  
	}
	
	
	free(temp);
}